

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMPCG.cpp
# Opt level: O0

void __thiscall phaeton::OMPCG::visitDivExpr(OMPCG *this,DivExpr *E)

{
  allocator local_39;
  string local_38;
  DivExpr *local_18;
  DivExpr *E_local;
  OMPCG *this_local;
  
  local_18 = E;
  E_local = (DivExpr *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"/",&local_39);
  visitBinOpExpr(this,&E->super_ExpressionNode,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void OMPCG::visitDivExpr(const DivExpr *E) { visitBinOpExpr(E, "/"); }